

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number.cpp
# Opt level: O2

Variable __thiscall
LiteScript::_Type_NUMBER::OLess(_Type_NUMBER *this,Variable *obj1,Variable *obj2)

{
  Number *pNVar1;
  bool bVar2;
  Object *pOVar3;
  Type *pTVar4;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar5;
  Variable VVar6;
  Variable tmp;
  Variable VStack_38;
  
  pOVar3 = Variable::operator->(obj2);
  Memory::Create((Memory *)this,(Type *)pOVar3->memory);
  pOVar3 = Variable::operator->((Variable *)in_RCX);
  pTVar4 = Object::GetType(pOVar3);
  bVar2 = Type::operator!=(pTVar4,(Type *)obj1);
  if (bVar2) {
    Variable::Convert(&VStack_38,in_RCX);
    pOVar3 = Variable::operator->(&VStack_38);
    pTVar4 = Object::GetType(pOVar3);
    bVar2 = Type::operator==(pTVar4,(Type *)obj1);
    if (bVar2) {
      pOVar3 = Variable::operator->(obj2);
      pNVar1 = (Number *)pOVar3->data;
      pOVar3 = Variable::operator->(&VStack_38);
      bVar2 = Number::operator<(pNVar1,(Number *)pOVar3->data);
      pOVar3 = Variable::operator->((Variable *)this);
      *(bool *)pOVar3->data = bVar2;
    }
    Variable::~Variable(&VStack_38);
    puVar5 = extraout_RDX;
  }
  else {
    pOVar3 = Variable::operator->(obj2);
    pNVar1 = (Number *)pOVar3->data;
    pOVar3 = Variable::operator->((Variable *)in_RCX);
    bVar2 = Number::operator<(pNVar1,(Number *)pOVar3->data);
    pOVar3 = Variable::operator->((Variable *)this);
    *(bool *)pOVar3->data = bVar2;
    puVar5 = extraout_RDX_00;
  }
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_NUMBER::OLess(const LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    Variable res = obj1->memory.Create(Type::BOOLEAN);
    if (obj2->GetType() != *this) {
        Variable tmp = obj2.Convert(*this);
        if (tmp->GetType() == *this)
            res->GetData<bool>() = (obj1->GetData<Number>() < tmp->GetData<Number>());
        return res;
    }
    res->GetData<bool>() = (obj1->GetData<Number>() < obj2->GetData<Number>());
    return res;
}